

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnCallIndirectExpr
          (BinaryReaderObjdumpDisassemble *this,uint32_t sig_index,uint32_t table_index)

{
  ObjdumpState *pOVar1;
  ulong uVar2;
  ulong uVar3;
  string_view sVar4;
  string_view sVar5;
  
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  sVar4 = ObjdumpNames::Get(&pOVar1->table_names,table_index);
  uVar2 = sVar4._M_len;
  sVar5 = ObjdumpNames::Get(&pOVar1->type_names,sig_index);
  uVar3 = sVar5._M_len;
  if (uVar2 == 0 || uVar3 == 0) {
    if (uVar2 == 0) {
      if (uVar3 == 0) {
        LogOpcode(this,"%u (type %u)",(ulong)table_index,sig_index);
      }
      else {
        LogOpcode(this,"%u (type %u <%.*s>)",(ulong)table_index,sig_index,uVar3 & 0xffffffff,
                  sVar5._M_str);
      }
    }
    else {
      LogOpcode(this,"%u <%.*s> (type %u)",(ulong)table_index,uVar2 & 0xffffffff,sVar4._M_str,
                sig_index);
    }
  }
  else {
    LogOpcode(this,"%u <%.*s> (type %u <%.*s>)",(ulong)table_index,uVar2 & 0xffffffff,sVar4._M_str,
              sig_index,(undefined1  [16])sVar5);
  }
  this->skip_next_opcode_ = true;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnCallIndirectExpr(
    uint32_t sig_index,
    uint32_t table_index) {
  std::string_view table_name = GetTableName(table_index);
  std::string_view type_name = GetTypeName(sig_index);
  if (!type_name.empty() && !table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u <" PRIstringview ">)",
              table_index, WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else if (!table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u)", table_index,
              WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index);
  } else if (!type_name.empty()) {
    LogOpcode("%u (type %u <" PRIstringview ">)", table_index, sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else {
    LogOpcode("%u (type %u)", table_index, sig_index);
  }
  skip_next_opcode_ = true;
  return Result::Ok;
}